

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

SwitchStmt * new_switch_stmt(void *expr,List *cases,void *defexpr)

{
  Token *pTVar1;
  void *pvVar2;
  SwitchStmt *pSVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x28);
  pSVar3 = (SwitchStmt *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = 0;
  *puVar4 = switch_eval;
  pTVar1 = (Token *)puVar4[1];
  (pSVar3->node).eval = (eval_handler_)*puVar4;
  (pSVar3->node).token = pTVar1;
  pSVar3->expr = expr;
  pSVar3->cases = cases;
  pSVar3->t_default = defexpr;
  return pSVar3;
}

Assistant:

SwitchStmt* new_switch_stmt(void* expr, List* cases, void* defexpr){
    SwitchStmt* stmt = new(SwitchStmt);
    stmt->node = tree_node_(NULL, eval_handler(switch_eval));
    stmt->expr = expr;
    stmt->cases = cases;
    stmt->t_default = defexpr;
    return stmt;
}